

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O2

void __thiscall CLParam<double>::~CLParam(CLParam<double> *this)

{
  ~CLParam(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~CLParam() {}